

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreImporter.cpp
# Opt level: O1

void __thiscall
Assimp::Ogre::OgreImporter::InternReadFile
          (OgreImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  CIrrXML_IOStreamReader *this_00;
  IrrXMLReader *reader_00;
  runtime_error *this_01;
  unique_ptr<Assimp::Ogre::Mesh,_std::default_delete<Assimp::Ogre::Mesh>_> mesh;
  MemoryStreamReader reader;
  _Head_base<0UL,_Assimp::Ogre::Mesh_*,_false> local_78;
  undefined1 local_70 [56];
  OgreImporter *local_38;
  IOStream *_stream;
  
  pcVar1 = local_70 + 0x10;
  local_70._0_8_ = pcVar1;
  local_38 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"rb","");
  iVar3 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_70._0_8_);
  _stream = (IOStream *)CONCAT44(extraout_var,iVar3);
  if ((pointer)local_70._0_8_ != pcVar1) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  if (_stream != (IOStream *)0x0) {
    local_70._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,".mesh","");
    bVar2 = EndsWith(pFile,(string *)local_70,false);
    if ((pointer)local_70._0_8_ != pcVar1) {
      operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
    }
    if (bVar2) {
      StreamReader<false,_false>::StreamReader((StreamReader<false,_false> *)local_70,_stream,false)
      ;
      local_78._M_head_impl =
           OgreBinarySerializer::ImportMesh((StreamReader<false,_false> *)local_70);
      OgreBinarySerializer::ImportSkeleton(pIOHandler,local_78._M_head_impl);
      ReadMaterials(local_38,pFile,pIOHandler,pScene,local_78._M_head_impl);
      Ogre::Mesh::ConvertToAssimpScene(local_78._M_head_impl,pScene);
      std::unique_ptr<Assimp::Ogre::Mesh,_std::default_delete<Assimp::Ogre::Mesh>_>::~unique_ptr
                ((unique_ptr<Assimp::Ogre::Mesh,_std::default_delete<Assimp::Ogre::Mesh>_> *)
                 &local_78);
      StreamReader<false,_false>::~StreamReader((StreamReader<false,_false> *)local_70);
    }
    else {
      this_00 = (CIrrXML_IOStreamReader *)operator_new(0x30);
      CIrrXML_IOStreamReader::CIrrXML_IOStreamReader(this_00,_stream);
      reader_00 = irr::io::createIrrXMLReader((IFileReadCallBack *)this_00);
      local_70._0_8_ = OgreXmlSerializer::ImportMesh(reader_00);
      OgreXmlSerializer::ImportSkeleton(pIOHandler,(MeshXml *)local_70._0_8_);
      ReadMaterials(local_38,pFile,pIOHandler,pScene,(MeshXml *)local_70._0_8_);
      MeshXml::ConvertToAssimpScene((MeshXml *)local_70._0_8_,pScene);
      std::unique_ptr<Assimp::Ogre::MeshXml,_std::default_delete<Assimp::Ogre::MeshXml>_>::
      ~unique_ptr((unique_ptr<Assimp::Ogre::MeshXml,_std::default_delete<Assimp::Ogre::MeshXml>_> *)
                  local_70);
      if (reader_00 != (IrrXMLReader *)0x0) {
        (*reader_00->_vptr_IIrrXMLReader[1])(reader_00);
      }
      (*(this_00->super_IFileReadCallBack)._vptr_IFileReadCallBack[1])(this_00);
      (*_stream->_vptr_IOStream[1])(_stream);
    }
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                 "Failed to open file ",pFile);
  std::runtime_error::runtime_error(this_01,(string *)local_70);
  *(undefined ***)this_01 = &PTR__runtime_error_007fd498;
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OgreImporter::InternReadFile(const std::string &pFile, aiScene *pScene, Assimp::IOSystem *pIOHandler)
{
    // Open source file
    IOStream *f = pIOHandler->Open(pFile, "rb");
    if (!f) {
        throw DeadlyImportError("Failed to open file " + pFile);
    }

    // Binary .mesh import
    if (EndsWith(pFile, ".mesh", false))
    {
        /// @note MemoryStreamReader takes ownership of f.
        MemoryStreamReader reader(f);

        // Import mesh
        std::unique_ptr<Mesh> mesh(OgreBinarySerializer::ImportMesh(&reader));

        // Import skeleton
        OgreBinarySerializer::ImportSkeleton(pIOHandler, mesh.get());

        // Import mesh referenced materials
        ReadMaterials(pFile, pIOHandler, pScene, mesh.get());

        // Convert to Assimp
        mesh->ConvertToAssimpScene(pScene);
    }
    // XML .mesh.xml import
    else
    {
        /// @note XmlReader does not take ownership of f, hence the scoped ptr.
        std::unique_ptr<IOStream> scopedFile(f);
        std::unique_ptr<CIrrXML_IOStreamReader> xmlStream(new CIrrXML_IOStreamReader(scopedFile.get()));
        std::unique_ptr<XmlReader> reader(irr::io::createIrrXMLReader(xmlStream.get()));

        // Import mesh
        std::unique_ptr<MeshXml> mesh(OgreXmlSerializer::ImportMesh(reader.get()));

        // Import skeleton
        OgreXmlSerializer::ImportSkeleton(pIOHandler, mesh.get());

        // Import mesh referenced materials
        ReadMaterials(pFile, pIOHandler, pScene, mesh.get());

        // Convert to Assimp
        mesh->ConvertToAssimpScene(pScene);
    }
}